

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree_read_scatter_single_test.c
# Opt level: O0

int main(int argc,char **argv)

{
  char *prefix_dir_00;
  int iVar1;
  undefined8 local_2048;
  kvtree *kvtree;
  int ranks;
  int rank;
  char prefix [4096];
  char *tmp_str;
  char *prefix_dir;
  char tmp [4096];
  uint local_1c;
  char **ppcStack_18;
  int rc;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  prefix[0xff8] = '\0';
  prefix[0xff9] = '\0';
  prefix[0xffa] = '\0';
  prefix[0xffb] = '\0';
  prefix[0xffc] = '\0';
  prefix[0xffd] = '\0';
  prefix[0xffe] = '\0';
  prefix[0xfff] = '\0';
  local_2048 = 0;
  ppcStack_18 = argv;
  argv_local._0_4_ = argc;
  if (argc == 2) {
    prefix_dir_00 = argv[1];
    MPI_Init(&argv_local,&stack0xffffffffffffffe8);
    MPI_Comm_rank(&ompi_mpi_comm_world,(long)&kvtree + 4);
    MPI_Comm_size(&ompi_mpi_comm_world,&kvtree);
    iVar1 = create_files(prefix_dir_00,(int)kvtree);
    if (iVar1 == 0) {
      MPI_Barrier(&ompi_mpi_comm_world);
      if (kvtree._4_4_ == 0) {
        snprintf((char *)&ranks,0x1000,"%s/PREFIX",prefix_dir_00);
        prefix[0xff7] = '\0';
        local_2048 = kvtree_new();
        iVar1 = kvtree_read_scatter_single(&ranks,local_2048);
        if (iVar1 == 0) {
          kvtree_util_get_str(local_2048,"0",prefix + 0xff8);
          iVar1 = strcmp((char *)prefix._4088_8_,"test data");
          if (iVar1 == 0) {
            kvtree_print(local_2048,4);
            kvtree_delete(&local_2048);
            snprintf((char *)&prefix_dir,0x1000,"%s/PREFIX.0.0",prefix_dir_00);
            unlink((char *)&prefix_dir);
            local_2048 = kvtree_new();
            iVar1 = kvtree_read_scatter_single(&ranks,local_2048);
            if (iVar1 == 0) {
              printf("kvtree_read_scatter_single() with missing file incorrectly succeeded\n");
            }
            local_1c = (uint)(iVar1 == 0);
          }
          else {
            printf("Got back wrong data (got %s, expected \"test data\")\n",prefix._4088_8_);
            local_1c = 1;
          }
        }
        else {
          printf("test_kvtree_read_scatter_single failed for %s\n",&ranks);
          local_1c = 1;
        }
      }
      else {
        local_1c = 0;
      }
      kvtree_delete(&local_2048);
      if (kvtree._4_4_ == 0) {
        snprintf((char *)&prefix_dir,0x1000,"rm -f %s/PREFIX*",prefix_dir_00);
        system((char *)&prefix_dir);
      }
      MPI_Finalize();
      argv_local._4_4_ = local_1c;
    }
    else {
      printf("Error creating files\n");
      argv_local._4_4_ = 1;
    }
    return argv_local._4_4_;
  }
  printf("USAGE:\n");
  printf("\n");
  printf("    %s TEMP_DIRECTORY\n",*ppcStack_18);
  printf("\n");
  printf("TEMP_DIRECTORY: A temporary directory to store test files in.\n");
  exit(1);
}

Assistant:

int main(int argc, char** argv)
{
  int rc;
  char tmp[PATH_MAX];
  char* prefix_dir;
  char* tmp_str = NULL;
  char prefix[PATH_MAX];
  int rank, ranks;
  kvtree* kvtree = NULL;

  if (argc != 2) {
    printf("USAGE:\n");
    printf("\n");
    printf("    %s TEMP_DIRECTORY\n", argv[0]);
    printf("\n");
    printf("TEMP_DIRECTORY: A temporary directory to store test files in.\n");
    exit(1);
  }

  prefix_dir = argv[1];

  MPI_Init(&argc, &argv);
  MPI_Comm_rank(MPI_COMM_WORLD, &rank);
  MPI_Comm_size(MPI_COMM_WORLD, &ranks);

  /* Create our prefix files */
  rc = create_files(prefix_dir, ranks);
  if (rc != 0) {
    printf("Error creating files\n");
    return 1;
  }

  MPI_Barrier(MPI_COMM_WORLD);

  /* Only read back the file with rank 0 */
  if (rank != 0) {
    rc = 0;
    goto end;
  }

  /* Construct path to our main PREFIX file */
  snprintf(prefix, sizeof(prefix), "%s/PREFIX", prefix_dir);
  prefix[sizeof(prefix) - 1] = '\0';

  /* Read our PREFIX files */
  kvtree = kvtree_new();
  rc = kvtree_read_scatter_single(prefix, kvtree);
  if (rc != KVTREE_SUCCESS) {
    printf("test_kvtree_read_scatter_single failed for %s\n", prefix);
    rc = 1;
    goto end;
  }

  /* Sanity test a value */
  kvtree_util_get_str(kvtree, "0", &tmp_str);
  if (strcmp(tmp_str, "test data") != 0) {
    printf("Got back wrong data (got %s, expected \"test data\")\n", tmp_str);
    rc = 1;
    goto end;
  }
  kvtree_print(kvtree, 4);
  kvtree_delete(&kvtree);

  /*
   * Remove PREFIX.0.0 to induce a failure.
   */
  snprintf(tmp, sizeof(tmp), "%s/PREFIX.0.0", prefix_dir);
  unlink(tmp);

  /* Attempt to call kvtree_read_scatter_single() - it should fail. */
  kvtree = kvtree_new();
  rc = kvtree_read_scatter_single(prefix, kvtree);
  if (rc == KVTREE_SUCCESS) {
    printf("kvtree_read_scatter_single() with missing file incorrectly succeeded\n");
    rc = 1;
  } else {
    /* success */
    rc = 0;
  }

end:
  kvtree_delete(&kvtree);

  if (rank == 0) {
    /* Remove our test files */
    snprintf(tmp, sizeof(tmp), "rm -f %s/PREFIX*", prefix_dir);
    system(tmp);
  }
  MPI_Finalize();

  return rc;
}